

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall cmQtAutoMocUic::ParseCacheWrite(cmQtAutoMocUic *this)

{
  bool bVar1;
  string *fileName;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  bVar2 = true;
  if ((this->BaseEval_).ParseCacheChanged == true) {
    if ((this->Logger_).Verbosity_ != 0) {
      cmQtAutoGen::Quoted(&local_40,&(this->BaseConst_).ParseCacheFile);
      std::operator+(&local_60,"Writing parse cache file ",&local_40);
      cmQtAutoGenerator::Logger::Info(&this->Logger_,GEN,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
    }
    fileName = &(this->BaseConst_).ParseCacheFile;
    bVar1 = ParseCacheT::WriteToFile(&(this->BaseEval_).ParseCache,fileName);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Parse cache file writing failed.",(allocator<char> *)&local_40
                );
      cmQtAutoGenerator::Logger::ErrorFile(&this->Logger_,GEN,fileName,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmQtAutoMocUic::ParseCacheWrite()
{
  if (BaseEval().ParseCacheChanged) {
    if (Log().Verbose()) {
      Log().Info(GenT::GEN,
                 "Writing parse cache file " +
                   Quoted(BaseConst().ParseCacheFile));
    }
    if (!BaseEval().ParseCache.WriteToFile(BaseConst().ParseCacheFile)) {
      Log().ErrorFile(GenT::GEN, BaseConst().ParseCacheFile,
                      "Parse cache file writing failed.");
      return false;
    }
  }
  return true;
}